

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_services.c
# Opt level: O3

int csp_get_memfree(uint16_t node,uint32_t timeout,uint32_t *size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  
  uVar4 = 0;
  iVar2 = csp_transaction_w_opts('\x02',node,'\x03',timeout,(void *)0x0,0,size,4,0x40);
  iVar3 = -3;
  if (iVar2 == 4) {
    uVar1 = *size;
    uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    iVar3 = 0;
  }
  *size = uVar4;
  return iVar3;
}

Assistant:

int csp_get_memfree(uint16_t node, uint32_t timeout, uint32_t * size) {

	int status = csp_transaction_w_opts(CSP_PRIO_NORM, node, CSP_MEMFREE, timeout, NULL, 0, size, sizeof(*size), CSP_O_CRC32);
	if (status == sizeof(*size)) {
		*size = be32toh(*size);
		return CSP_ERR_NONE;
	}
	*size = 0;
	return CSP_ERR_TIMEDOUT;
}